

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LoadIniSettingsFromDisk(char *ini_filename)

{
  void *pvVar1;
  char *file_data;
  size_t file_data_size;
  char *in_stack_00000018;
  size_t in_stack_00000088;
  char *in_stack_00000090;
  void *ptr;
  
  ptr = (void *)0x0;
  pvVar1 = ImFileLoadToMemory(in_stack_00000018,ini_filename,(size_t *)file_data_size,
                              file_data._4_4_);
  if (pvVar1 != (void *)0x0) {
    LoadIniSettingsFromMemory(in_stack_00000090,in_stack_00000088);
    MemFree(ptr);
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromDisk(const char* ini_filename)
{
    size_t file_data_size = 0;
    char* file_data = (char*)ImFileLoadToMemory(ini_filename, "rb", &file_data_size);
    if (!file_data)
        return;
    LoadIniSettingsFromMemory(file_data, (size_t)file_data_size);
    IM_FREE(file_data);
}